

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O3

bool __thiscall cmTarget::HaveBuildTreeRPATH(cmTarget *this,string *config)

{
  bool bVar1;
  char *val;
  LinkImplementationLibraries *pLVar2;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"SKIP_BUILD_RPATH","");
  val = GetProperty(this,&local_48,this->Makefile);
  bVar1 = cmSystemTools::IsOn(val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar1) &&
     (pLVar2 = GetLinkImplementationLibrariesInternal(this,config,this),
     pLVar2 != (LinkImplementationLibraries *)0x0)) {
    return (pLVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pLVar2->Libraries).super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  }
  return false;
}

Assistant:

bool cmTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    return false;
    }
  if(LinkImplementationLibraries const* impl =
     this->GetLinkImplementationLibraries(config))
    {
    return !impl->Libraries.empty();
    }
  return false;
}